

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
checkInterfacePropertyCompatibility<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_6)

{
  pointer pcVar1;
  cmLocalGenerator *localGenerator;
  cmGeneratorTarget *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *__s;
  pointer pbVar3;
  int iVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar6;
  cmGeneratorExpressionInterpreter *this_00;
  ostream *poVar7;
  size_t sVar8;
  pointer ppcVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  consistent;
  string reportEntry;
  string report;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ifacePropContent;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  string interfaceProperty;
  undefined1 local_3a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  cmGeneratorExpressionInterpreter *local_378;
  string local_370;
  undefined1 *local_350;
  long local_348;
  undefined1 local_340;
  undefined7 uStack_33f;
  string local_330;
  _Base_ptr local_310;
  _Base_ptr local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f8;
  char *local_2f0;
  size_type local_2e8;
  char local_2e0;
  undefined7 uStack_2df;
  undefined8 uStack_2d8;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  char *local_2a8;
  size_type local_2a0;
  char local_298;
  undefined7 uStack_297;
  undefined8 uStack_290;
  char *local_288;
  size_type local_280;
  char local_278;
  undefined7 uStack_277;
  undefined8 uStack_270;
  string local_268;
  undefined1 local_248 [17];
  undefined7 uStack_237;
  undefined8 uStack_230;
  ios_base local_1d8 [264];
  char *local_d0;
  pointer local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d0 = defaultValue;
  getTypedProperty<std::__cxx11::string>
            (__return_storage_ptr__,tgt,p,(cmGeneratorExpressionInterpreter *)0x0);
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_a8,tgt);
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar10 = _Var5._M_current !=
           local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_308 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_300 = local_a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_310 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_2f8 = _Var5._M_current;
  if (local_308 != local_310 &&
      _Var5._M_current !=
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x11f0,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = std::basic_string<char>]"
                 );
  }
  pvVar6 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar6->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar6->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    local_2b0 = __return_storage_ptr__;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330," * Target \"","");
    std::__cxx11::string::_M_append((char *)&local_330,(ulong)(tgt->Target->Name)._M_dataplus._M_p);
    if (local_2f8 != local_300) {
      std::__cxx11::string::append((char *)&local_330);
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      local_288 = &local_278;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_288,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
      if (local_288 == &local_278) {
        uStack_230 = uStack_270;
        local_288 = local_248 + 0x10;
      }
      uStack_237 = uStack_277;
      local_248[0x10] = local_278;
      local_248._8_8_ = local_280;
      local_280 = 0;
      local_278 = '\0';
      local_248._0_8_ = local_288;
      local_288 = &local_278;
      std::__cxx11::string::_M_append((char *)&local_330,local_248._0_8_);
      if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
        operator_delete((void *)local_248._0_8_,stack0xfffffffffffffdc8 + 1);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,CONCAT71(uStack_277,local_278) + 1);
      }
    }
    std::__cxx11::string::append((char *)&local_330);
    std::operator+(&local_50,"INTERFACE_",p);
    iVar4 = std::__cxx11::string::compare((char *)p);
    if (iVar4 == 0) {
      this_00 = (cmGeneratorExpressionInterpreter *)operator_new(0x68);
      localGenerator = tgt->LocalGenerator;
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      pcVar1 = (config->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_268,pcVar1,pcVar1 + config->_M_string_length);
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                (this_00,localGenerator,&local_268,tgt,&local_70);
      local_378 = this_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_378 = (cmGeneratorExpressionInterpreter *)0x0;
    }
    ppcVar9 = (pvVar6->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_c8 = (pvVar6->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar9 != local_c8) {
      bVar11 = local_308 != local_310;
      bVar12 = local_2f8 == local_300;
      do {
        this = *ppcVar9;
        cmGeneratorTarget::GetPropertyKeys_abi_cxx11_(&local_c0,this);
        _Var5 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_c0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_c0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_50);
        pbVar3 = local_c0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        getTypedProperty<std::__cxx11::string>(&local_2d0,this,&local_50,local_378);
        pbVar2 = local_2f8;
        local_350 = &local_340;
        local_348 = 0;
        local_340 = 0;
        if (_Var5._M_current == pbVar3) {
          iVar4 = 3;
          if (bVar12 && bVar11) {
LAB_0017943c:
            local_90[0] = local_80;
            pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
            local_248._8_8_ = 0;
            stack0xfffffffffffffdc8 = stack0xfffffffffffffdc8 & 0xffffffffffffff00;
            local_248._0_8_ = local_248 + 0x10;
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_248);
            if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
              operator_delete((void *)local_248._0_8_,stack0xfffffffffffffdc8 + 1);
            }
            if (local_90[0] != local_80) {
              operator_delete(local_90[0],local_80[0] + 1);
            }
            if (_Var5._M_current != pbVar3) {
              consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_3a0,__return_storage_ptr__,&local_2d0,t);
              std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_350);
              __s = local_d0;
              sVar8 = __return_storage_ptr__->_M_string_length;
              bVar13 = true;
              if (sVar8 == local_3a0._16_8_) {
                if (sVar8 == 0) {
                  bVar13 = false;
                }
                else {
                  iVar4 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(void *)local_3a0._8_8_,
                               sVar8);
                  bVar13 = iVar4 != 0;
                }
              }
              compatibilityAgree_abi_cxx11_((string *)local_248,t,bVar13);
              std::__cxx11::string::_M_append((char *)&local_330,local_248._0_8_);
              if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
                operator_delete((void *)local_248._0_8_,stack0xfffffffffffffdc8 + 1);
              }
              if (local_3a0[0] == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_248,"Property ",9);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_248,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," on target \"",0xc);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(tgt->Target->Name)._M_dataplus._M_p,
                                    (tgt->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"\" is\nimplied to be ",0x13);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar7 + (int)poVar7->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar8 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar8);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,
                           " because it was used to determine the link libraries\nalready. The INTERFACE_"
                           ,0x4c);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7," property on\ndependency \"",0x19);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(this->Target->Name)._M_dataplus._M_p,
                                    (this->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"\" is in conflict.\n",0x12);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_370);
                goto LAB_00179990;
              }
              iVar4 = 3;
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              goto LAB_001799d3;
            }
            iVar4 = 3;
          }
        }
        else {
          std::__cxx11::string::append((char *)&local_350);
          std::__cxx11::string::_M_append
                    ((char *)&local_350,(ulong)(this->Target->Name)._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&local_350);
          local_2f0 = &local_2e0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f0,local_2d0._M_dataplus._M_p,
                     local_2d0._M_dataplus._M_p + local_2d0._M_string_length);
          if (local_2f0 == &local_2e0) {
            uStack_230 = uStack_2d8;
            local_2f0 = local_248 + 0x10;
          }
          uStack_237 = uStack_2df;
          local_248[0x10] = local_2e0;
          local_248._8_8_ = local_2e8;
          local_2e8 = 0;
          local_2e0 = '\0';
          local_248._0_8_ = local_2f0;
          local_2f0 = &local_2e0;
          std::__cxx11::string::_M_append((char *)&local_350,local_248._0_8_);
          __return_storage_ptr__ = local_2b0;
          if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
            operator_delete((void *)local_248._0_8_,stack0xfffffffffffffdc8 + 1);
          }
          if (local_2f0 != &local_2e0) {
            operator_delete(local_2f0,CONCAT71(uStack_2df,local_2e0) + 1);
          }
          std::__cxx11::string::append((char *)&local_350);
          if (pbVar2 == local_300) {
            if (local_308 != local_310) goto LAB_0017943c;
            if (bVar10) {
              consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_3a0,__return_storage_ptr__,&local_2d0,t);
              std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_350);
              sVar8 = __return_storage_ptr__->_M_string_length;
              bVar10 = true;
              if (sVar8 == local_3a0._16_8_) {
                if (sVar8 == 0) {
                  bVar10 = false;
                }
                else {
                  iVar4 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(void *)local_3a0._8_8_,
                               sVar8);
                  bVar10 = iVar4 != 0;
                }
              }
              compatibilityAgree_abi_cxx11_((string *)local_248,t,bVar10);
              std::__cxx11::string::_M_append((char *)&local_330,local_248._0_8_);
              if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
                operator_delete((void *)local_248._0_8_,stack0xfffffffffffffdc8 + 1);
              }
              if (local_3a0[0] == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_248,"The INTERFACE_",0xe);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_248,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7," property of \"",0xe);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(this->Target->Name)._M_dataplus._M_p,
                                    (this->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7,"\" does\nnot agree with the value of ",0x23);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar7," already determined\nfor \"",0x19);
                poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar7,(tgt->Target->Name)._M_dataplus._M_p,
                                    (tgt->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".\n",3);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_370);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_370._M_dataplus._M_p != &local_370.field_2) {
                  operator_delete(local_370._M_dataplus._M_p,
                                  local_370.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
                std::ios_base::~ios_base(local_1d8);
                iVar4 = 2;
              }
              else {
                iVar4 = 3;
                std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a0._8_8_ != &local_388) {
                operator_delete((void *)local_3a0._8_8_,local_388._0_8_ + 1);
              }
            }
            else {
              local_248._0_8_ = local_248 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_248,local_350,local_350 + local_348);
              std::__cxx11::string::append((char *)local_248);
              std::__cxx11::string::_M_append((char *)&local_330,local_248._0_8_);
              if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
                operator_delete((void *)local_248._0_8_,stack0xfffffffffffffdc8 + 1);
              }
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              iVar4 = 0;
            }
            bVar10 = true;
          }
          else {
            consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_3a0,__return_storage_ptr__,&local_2d0,t);
            std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_350);
            sVar8 = __return_storage_ptr__->_M_string_length;
            bVar13 = true;
            if (sVar8 == local_3a0._16_8_) {
              if (sVar8 == 0) {
                bVar13 = false;
              }
              else {
                iVar4 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(void *)local_3a0._8_8_,
                             sVar8);
                bVar13 = iVar4 != 0;
              }
            }
            compatibilityAgree_abi_cxx11_((string *)local_248,t,bVar13);
            std::__cxx11::string::_M_append((char *)&local_330,local_248._0_8_);
            if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
              operator_delete((void *)local_248._0_8_,stack0xfffffffffffffdc8 + 1);
            }
            if (local_3a0[0] == false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_248,"Property ",9)
              ;
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_248,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7," on target \"",0xc);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(tgt->Target->Name)._M_dataplus._M_p,
                                  (tgt->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"\" does\nnot match the INTERFACE_",0x1f);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(p->_M_dataplus)._M_p,p->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7," property requirement\nof dependency \"",0x25);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(this->Target->Name)._M_dataplus._M_p,
                                  (this->Target->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".\n",3);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(&local_370);
LAB_00179990:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_370._M_dataplus._M_p != &local_370.field_2) {
                operator_delete(local_370._M_dataplus._M_p,
                                local_370.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
              std::ios_base::~ios_base(local_1d8);
              iVar4 = 2;
            }
            else {
              iVar4 = 3;
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
            }
LAB_001799d3:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._8_8_ != &local_388) {
              operator_delete((void *)local_3a0._8_8_,local_388._0_8_ + 1);
            }
          }
        }
        if (local_350 != &local_340) {
          operator_delete(local_350,CONCAT71(uStack_33f,local_340) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_c0);
      } while (((iVar4 == 3) || (iVar4 == 0)) && (ppcVar9 = ppcVar9 + 1, ppcVar9 != local_c8));
    }
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_2a8 = &local_298;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a8,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
    if (local_2a8 == &local_298) {
      uStack_230 = uStack_290;
      local_248._0_8_ = local_248 + 0x10;
    }
    else {
      local_248._0_8_ = local_2a8;
    }
    uStack_237 = uStack_297;
    local_248[0x10] = local_298;
    local_248._8_8_ = local_2a0;
    local_2a0 = 0;
    local_298 = '\0';
    local_2a8 = &local_298;
    compatibilityType_abi_cxx11_((string *)local_3a0,t);
    cmGeneratorTarget::ReportPropertyOrigin
              (tgt,p,(string *)local_248,&local_330,(string *)local_3a0);
    if ((undefined1 *)CONCAT71(local_3a0._1_7_,local_3a0[0]) != local_3a0 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_3a0._1_7_,local_3a0[0]),local_3a0._16_8_ + 1);
    }
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_,stack0xfffffffffffffdc8 + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,CONCAT71(uStack_297,local_298) + 1);
    }
    if (local_378 != (cmGeneratorExpressionInterpreter *)0x0) {
      std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                ((default_delete<cmGeneratorExpressionInterpreter> *)&local_378,local_378);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
    std::find(headPropKeys.begin(), headPropKeys.end(), p) !=
    headPropKeys.end();

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter(
    p == "POSITION_INDEPENDENT_CODE" ? new cmGeneratorExpressionInterpreter(
                                         tgt->GetLocalGenerator(), config, tgt)
                                     : nullptr);

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = std::find(propKeys.begin(), propKeys.end(),
                                      interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}